

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O0

int64_t av1_segmented_frame_error
                  (int use_hbd,int bd,uint8_t *ref,int ref_stride,uint8_t *dst,int dst_stride,
                  int p_width,int p_height,uint8_t *segment_map,int segment_map_stride)

{
  int64_t iVar1;
  int in_EDI;
  uint16_t *unaff_retaddr;
  int in_stack_0000000c;
  uint16_t *in_stack_00000010;
  int in_stack_00000028;
  undefined8 in_stack_fffffffffffffff8;
  int dst_stride_00;
  
  dst_stride_00 = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  if (in_EDI == 0) {
    iVar1 = segmented_frame_error
                      ((uint8_t *)in_stack_00000010,in_stack_0000000c,(uint8_t *)unaff_retaddr,
                       dst_stride_00,(int)in_stack_fffffffffffffff8,0,dst,in_stack_00000028);
  }
  else {
    iVar1 = highbd_segmented_frame_error
                      (in_stack_00000010,in_stack_0000000c,unaff_retaddr,dst_stride_00,
                       (int)in_stack_fffffffffffffff8,in_EDI,(int)dst,
                       (uint8_t *)CONCAT44(ref_stride,in_stack_00000028),(int)ref);
  }
  return iVar1;
}

Assistant:

int64_t av1_segmented_frame_error(int use_hbd, int bd, const uint8_t *ref,
                                  int ref_stride, uint8_t *dst, int dst_stride,
                                  int p_width, int p_height,
                                  uint8_t *segment_map,
                                  int segment_map_stride) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (use_hbd) {
    return highbd_segmented_frame_error(
        CONVERT_TO_SHORTPTR(ref), ref_stride, CONVERT_TO_SHORTPTR(dst),
        dst_stride, p_width, p_height, bd, segment_map, segment_map_stride);
  }
#endif
  (void)use_hbd;
  (void)bd;
  return segmented_frame_error(ref, ref_stride, dst, dst_stride, p_width,
                               p_height, segment_map, segment_map_stride);
}